

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ary_heap.hpp
# Opt level: O0

void __thiscall
boost::
d_ary_heap_indirect<unsigned_long,_4UL,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>,_std::less<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
::preserve_heap_property_up
          (d_ary_heap_indirect<unsigned_long,_4UL,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>,_std::less<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *this,size_type index)

{
  bool bVar1;
  reference pvVar2;
  double *pdVar3;
  size_type sVar4;
  size_type in_RSI;
  d_ary_heap_indirect<unsigned_long,_4UL,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>,_boost::iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>,_std::less<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_RDI;
  unsigned_long parent_value_1;
  size_type parent_index_1;
  size_type i;
  unsigned_long parent_value;
  size_type parent_index;
  distance_type currently_being_moved_dist;
  unsigned_long currently_being_moved;
  size_type num_levels_moved;
  size_type orig_index;
  unsigned_long *in_stack_ffffffffffffff88;
  put_get_helper<double_&,_boost::iterator_property_map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_double,_double_&>_>
  *in_stack_ffffffffffffff90;
  unsigned_long *v;
  value_type in_stack_ffffffffffffff98;
  value_type vVar5;
  ulong local_48;
  double local_30;
  unsigned_long *local_28;
  ulong local_20;
  size_type local_18;
  size_type local_10;
  
  local_20 = 0;
  if (in_RSI != 0) {
    local_18 = in_RSI;
    local_10 = in_RSI;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->data,in_RSI);
    local_28 = (unsigned_long *)*pvVar2;
    pdVar3 = get<boost::iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,double,double&>,double&,unsigned_long>
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_30 = *pdVar3;
    while (local_10 != 0) {
      sVar4 = parent(local_10);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&in_RDI->data,sVar4);
      pdVar3 = get<boost::iterator_property_map<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,double,double&>,double&,unsigned_long>
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      bVar1 = std::less<double>::operator()((less<double> *)in_RDI,&local_30,pdVar3);
      if (!bVar1) break;
      local_20 = local_20 + 1;
      local_10 = sVar4;
    }
    local_10 = local_18;
    for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
      sVar4 = parent(local_10);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&in_RDI->data,sVar4);
      vVar5 = *pvVar2;
      put<boost::iterator_property_map<unsigned_long*,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,unsigned_long,unsigned_long&>,unsigned_long&,unsigned_long,unsigned_long>
                ((put_get_helper<unsigned_long_&,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>_>
                  *)in_RDI,in_stack_ffffffffffffff98,(unsigned_long *)in_stack_ffffffffffffff90);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&in_RDI->data,local_10);
      *pvVar2 = vVar5;
      in_stack_ffffffffffffff98 = vVar5;
      local_10 = sVar4;
    }
    v = local_28;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&in_RDI->data,local_10);
    *pvVar2 = (value_type)v;
    put<boost::iterator_property_map<unsigned_long*,boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,int,boost::no_property>,unsigned_long>,unsigned_long,unsigned_long&>,unsigned_long&,unsigned_long,unsigned_long>
              ((put_get_helper<unsigned_long_&,_boost::iterator_property_map<unsigned_long_*,_boost::vec_adj_list_vertex_id_map<boost::property<boost::vertex_distance_t,_int,_boost::no_property>,_unsigned_long>,_unsigned_long,_unsigned_long_&>_>
                *)in_RDI,in_stack_ffffffffffffff98,v);
    verify_heap(in_RDI);
  }
  return;
}

Assistant:

void preserve_heap_property_up(size_type index) {
      size_type orig_index = index;
      size_type num_levels_moved = 0;
      // The first loop just saves swaps that need to be done in order to avoid
      // aliasing issues in its search; there is a second loop that does the
      // necessary swap operations
      if (index == 0) return; // Do nothing on root
      Value currently_being_moved = data[index];
      distance_type currently_being_moved_dist =
        get(distance, currently_being_moved);
      for (;;) {
        if (index == 0) break; // Stop at root
        size_type parent_index = parent(index);
        Value parent_value = data[parent_index];
        if (compare(currently_being_moved_dist, get(distance, parent_value))) {
          ++num_levels_moved;
          index = parent_index;
          continue;
        } else {
          break; // Heap property satisfied
        }
      }
      // Actually do the moves -- move num_levels_moved elements down in the
      // tree, then put currently_being_moved at the top
      index = orig_index;
      for (size_type i = 0; i < num_levels_moved; ++i) {
        size_type parent_index = parent(index);
        Value parent_value = data[parent_index];
        put(index_in_heap, parent_value, index);
        data[index] = parent_value;
        index = parent_index;
      }
      data[index] = currently_being_moved;
      put(index_in_heap, currently_being_moved, index);
      verify_heap();
    }